

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::L2NormCost::L2NormCost
          (L2NormCost *this,string *name,uint stateDimension,uint controlDimension)

{
  L2NormCostImplementation *this_00;
  uint in_ECX;
  int in_EDX;
  Cost *in_RDI;
  IndexRange controlRange;
  IndexRange stateRange;
  string *in_stack_ffffffffffffff98;
  IndexRange *in_stack_ffffffffffffffb8;
  CostAttributes *in_stack_ffffffffffffffc0;
  
  Cost::Cost(in_RDI,in_stack_ffffffffffffff98);
  in_RDI->_vptr_Cost = (_func_int **)&PTR__L2NormCost_003fae90;
  this_00 = (L2NormCostImplementation *)operator_new(0x250);
  L2NormCostImplementation::L2NormCostImplementation(this_00);
  in_RDI[1]._vptr_Cost = (_func_int **)this_00;
  if (in_EDX != 0) {
    CostAttributes::initializeCost
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(uint)((ulong)this_00 >> 0x20));
  }
  if (in_ECX != 0) {
    CostAttributes::initializeCost
              ((CostAttributes *)(ulong)in_ECX,(IndexRange *)0x0,(uint)((ulong)this_00 >> 0x20));
  }
  return;
}

Assistant:

L2NormCost::L2NormCost(const std::string &name, unsigned int stateDimension, unsigned int controlDimension)
            : Cost(name)
            , m_pimpl(new L2NormCostImplementation)
        {
            if (stateDimension > 0) {
                IndexRange stateRange;
                stateRange.offset = 0;
                stateRange.size = stateDimension;

                m_pimpl->stateCost.initializeCost(stateRange, stateDimension);
            }

            if (controlDimension > 0) {
                IndexRange controlRange;
                controlRange.offset = 0;
                controlRange.size = controlDimension;

                m_pimpl->controlCost.initializeCost(controlRange, controlDimension);
            }
        }